

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

BOOL Js::JavascriptOperators::GetItemReference
               (Var instance,RecyclableObject *propertyObject,uint32 index,Var *value,
               ScriptContext *requestContext)

{
  Type *pTVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  undefined4 extraout_var;
  RecyclableObject *pRVar7;
  Type *pTVar8;
  
  if (((propertyObject->type).ptr)->typeId != TypeIds_Null) {
    pTVar8 = &propertyObject->type;
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    do {
      iVar4 = (*(propertyObject->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x27])
                        (propertyObject,instance,(ulong)index,value,requestContext);
      if (iVar4 != 0) {
        return (uint)(iVar4 == 1);
      }
      BVar5 = RecyclableObject::SkipsPrototype(propertyObject);
      if (BVar5 != 0) break;
      pTVar1 = pTVar8->ptr;
      if ((pTVar1->flags & TypeFlagMask_HasSpecialPrototype) == TypeFlagMask_None) {
LAB_00aac813:
        propertyObject = (pTVar1->prototype).ptr;
      }
      else if (pTVar1->typeId == TypeIds_Proxy) {
        propertyObject = (pTVar1->prototype).ptr;
        if (propertyObject !=
            (((((((pTVar1->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)
              ->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).nullValue.
            ptr) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar6 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                      ,0x57a,
                                      "(type->GetPrototype() == instance->GetScriptContext()->GetLibrary()->GetNull())"
                                      ,
                                      "type->GetPrototype() == instance->GetScriptContext()->GetLibrary()->GetNull()"
                                     );
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar6 = 0;
          goto LAB_00aac813;
        }
      }
      else {
        iVar4 = (*(propertyObject->super_FinalizableObject).super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[6])(propertyObject);
        propertyObject = (RecyclableObject *)CONCAT44(extraout_var,iVar4);
      }
      pTVar8 = &propertyObject->type;
    } while (((propertyObject->type).ptr)->typeId != TypeIds_Null);
  }
  pRVar7 = ScriptContext::GetMissingItemResult(requestContext);
  *value = pRVar7;
  return 0;
}

Assistant:

BOOL JavascriptOperators::GetItemReference(Var instance, RecyclableObject* propertyObject, uint32 index, Var* value, ScriptContext* requestContext)
    {
        RecyclableObject* object = propertyObject;
        while (!JavascriptOperators::IsNull(object))
        {
            PropertyQueryFlags result;
            if ((result = object->GetItemReferenceQuery(instance, index, value, requestContext)) != PropertyQueryFlags::Property_NotFound)
            {
                return JavascriptConversion::PropertyQueryFlagsToBoolean(result);
            }
            if (object->SkipsPrototype())
            {
                break;
            }
            object = JavascriptOperators::GetPrototypeNoTrap(object);
        }
        *value = requestContext->GetMissingItemResult();
        return false;
    }